

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Bool startParsing(XML_Parser parser)

{
  unsigned_long uVar1;
  XML_Parser parser_local;
  
  if (parser->m_hash_secret_salt == 0) {
    uVar1 = generate_hash_secret_salt(parser);
    parser->m_hash_secret_salt = uVar1;
  }
  if (parser->m_ns == '\0') {
    parser_local._7_1_ = '\x01';
  }
  else {
    parser_local._7_1_ = setContext(parser,"xml=http://www.w3.org/XML/1998/namespace");
  }
  return parser_local._7_1_;
}

Assistant:

static XML_Bool /* only valid for root parser */
startParsing(XML_Parser parser) {
  /* hash functions must be initialized before setContext() is called */
  if (parser->m_hash_secret_salt == 0)
    parser->m_hash_secret_salt = generate_hash_secret_salt(parser);
  if (parser->m_ns) {
    /* implicit context only set for root parser, since child
       parsers (i.e. external entity parsers) will inherit it
    */
    return setContext(parser, implicitContext);
  }
  return XML_TRUE;
}